

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDLImporter::CreateTextureARGB8_3DGS_MDL3(MDLImporter *this,uchar *szData)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  aiTexture **ppaVar6;
  aiTexture *paVar7;
  aiTexel *paVar8;
  aiTexture **ppaVar9;
  aiScene *paVar10;
  ulong uVar11;
  ulong uVar12;
  uchar *szColorMap;
  uchar (*local_30) [3];
  
  puVar5 = this->mBuffer;
  SizeCheck(this,szData + (long)*(int *)(puVar5 + 0x38) * (long)*(int *)(puVar5 + 0x34),
            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
            ,0x8c);
  paVar7 = (aiTexture *)operator_new(0x428);
  paVar7->mWidth = 0;
  paVar7->mHeight = 0;
  paVar7->pcData = (aiTexel *)0x0;
  (paVar7->mFilename).length = 0;
  (paVar7->mFilename).data[0] = '\0';
  memset((paVar7->mFilename).data + 1,0x1b,0x3ff);
  paVar7->achFormatHint[0] = '\0';
  paVar7->achFormatHint[1] = '\0';
  paVar7->achFormatHint[2] = '\0';
  paVar7->achFormatHint[3] = '\0';
  uVar3 = *(uint *)(puVar5 + 0x34);
  paVar7->mWidth = uVar3;
  uVar4 = *(uint *)(puVar5 + 0x38);
  paVar7->mHeight = uVar4;
  paVar8 = (aiTexel *)operator_new__((ulong)(uVar4 * uVar3) << 2);
  paVar7->pcData = paVar8;
  SearchPalette(this,(uchar **)&local_30);
  if (paVar7->mHeight * paVar7->mWidth != 0) {
    uVar11 = 0;
    do {
      bVar2 = szData[uVar11];
      paVar7->pcData[uVar11].a = 0xff;
      paVar7->pcData[uVar11].r = local_30[bVar2][0];
      paVar7->pcData[uVar11].g = local_30[bVar2][1];
      paVar7->pcData[uVar11].b = local_30[bVar2][2];
      uVar11 = uVar11 + 1;
    } while (uVar11 < paVar7->mHeight * paVar7->mWidth);
  }
  if (local_30 != (uchar (*) [3])0x0 && local_30 != g_aclrDefaultColorMap) {
    operator_delete__(local_30);
  }
  paVar10 = this->pScene;
  ppaVar6 = paVar10->mTextures;
  ppaVar9 = (aiTexture **)operator_new__((ulong)(paVar10->mNumTextures + 1) << 3);
  paVar10->mTextures = ppaVar9;
  paVar10 = this->pScene;
  uVar11 = (ulong)paVar10->mNumTextures;
  if (paVar10->mNumTextures != 0) {
    uVar12 = 0;
    do {
      paVar10->mTextures[uVar12] = ppaVar6[uVar12];
      uVar12 = uVar12 + 1;
      paVar10 = this->pScene;
      uVar11 = (ulong)paVar10->mNumTextures;
    } while (uVar12 < uVar11);
  }
  paVar10->mTextures[uVar11] = paVar7;
  puVar1 = &this->pScene->mNumTextures;
  *puVar1 = *puVar1 + 1;
  if (ppaVar6 != (aiTexture **)0x0) {
    operator_delete__(ppaVar6);
    return;
  }
  return;
}

Assistant:

void MDLImporter::CreateTextureARGB8_3DGS_MDL3(const unsigned char* szData)
{
    const MDL::Header *pcHeader = (const MDL::Header*)mBuffer;  //the endianness is already corrected in the InternReadFile_3DGS_MDL345 function

    VALIDATE_FILE_SIZE(szData + pcHeader->skinwidth *
        pcHeader->skinheight);

    // allocate a new texture object
    aiTexture* pcNew = new aiTexture();
    pcNew->mWidth = pcHeader->skinwidth;
    pcNew->mHeight = pcHeader->skinheight;

    pcNew->pcData = new aiTexel[pcNew->mWidth * pcNew->mHeight];

    const unsigned char* szColorMap;
    this->SearchPalette(&szColorMap);

    // copy texture data
    for (unsigned int i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
    {
        const unsigned char val = szData[i];
        const unsigned char* sz = &szColorMap[val*3];

        pcNew->pcData[i].a = 0xFF;
        pcNew->pcData[i].r = *sz++;
        pcNew->pcData[i].g = *sz++;
        pcNew->pcData[i].b = *sz;
    }

    FreePalette(szColorMap);

    // store the texture
    aiTexture** pc = this->pScene->mTextures;
    this->pScene->mTextures = new aiTexture*[pScene->mNumTextures+1];
    for (unsigned int i = 0; i <pScene->mNumTextures;++i)
        pScene->mTextures[i] = pc[i];

    pScene->mTextures[this->pScene->mNumTextures] = pcNew;
    pScene->mNumTextures++;
    delete[] pc;
    return;
}